

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute_struct *
pugi::impl::anon_unknown_0::append_new_attribute(xml_node_struct *node,xml_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  
  pxVar3 = allocate_attribute(alloc);
  if (pxVar3 != (xml_attribute_struct *)0x0) {
    pxVar1 = node->first_attribute;
    if (pxVar1 == (xml_attribute_struct *)0x0) {
      node->first_attribute = pxVar3;
      pxVar1 = pxVar3;
    }
    else {
      pxVar2 = pxVar1->prev_attribute_c;
      pxVar2->next_attribute = pxVar3;
      pxVar3->prev_attribute_c = pxVar2;
    }
    pxVar1->prev_attribute_c = pxVar3;
  }
  return pxVar3;
}

Assistant:

PUGI_IMPL_FN_NO_INLINE xml_attribute_struct* append_new_attribute(xml_node_struct* node, xml_allocator& alloc)
	{
		if (!alloc.reserve()) return 0;

		xml_attribute_struct* attr = allocate_attribute(alloc);
		if (!attr) return 0;

		append_attribute(attr, node);

		return attr;
	}